

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
           *this,element_type *p,arrays_type *arrays_,size_t *num_destroyed)

{
  uint64_t hash;
  pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_&&>
  local_48;
  locator local_38;
  
  hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                   ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                    &p->first);
  *num_destroyed = *num_destroyed + 1;
  local_48.second = &p->second;
  local_48.first = &p->first;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
  ::
  nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>&&>>
            (&local_38,
             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_48);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, const arrays_type& arrays_,
                                 std::size_t& num_destroyed) {
        nosize_transfer_element(p, hash_for(key_from(*p)), arrays_, num_destroyed,
                                std::integral_constant < bool,
                                std::is_nothrow_move_constructible<init_type>::value ||
                                    !std::is_same<element_type, value_type>::value ||
                                    !std::is_copy_constructible<element_type>::value > {});
    }